

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gog.cpp
# Opt level: O0

void __thiscall
gog::anon_unknown_0::temporary_directory::~temporary_directory(temporary_directory *this)

{
  bool bVar1;
  char *in_RDI;
  
  bVar1 = boost::filesystem::path::empty((path *)0x141c95);
  if (!bVar1) {
    boost::filesystem::remove_all((path *)0x141cab);
    bVar1 = boost::filesystem::path::empty((path *)0x141cb7);
    if (!bVar1) {
      boost::filesystem::remove(in_RDI);
    }
  }
  std::_Destroy<std::__cxx11::string>((path *)0x141d6d);
  std::_Destroy<std::__cxx11::string>((path *)0x141d77);
  return;
}

Assistant:

~temporary_directory() {
		if(!path.empty()) {
			try {
				fs::remove_all(path);
				if(!parent.empty()) {
					fs::remove(parent);
				}
			} catch(...) {
				log_error << "Could not remove temporary directory " << path << '!';
			}
		}
	}